

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_install.cpp
# Opt level: O2

bool duckdb::IsHTTP(string *path)

{
  bool bVar1;
  bool bVar2;
  allocator local_92;
  allocator local_91;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  ::std::__cxx11::string::string((string *)&local_30,(string *)path);
  ::std::__cxx11::string::string((string *)&local_50,"http://",&local_91);
  bVar1 = StringUtil::StartsWith(&local_30,&local_50);
  bVar2 = true;
  if (!bVar1) {
    ::std::__cxx11::string::string((string *)&local_70,(string *)path);
    ::std::__cxx11::string::string((string *)&local_90,"https://",&local_92);
    bVar2 = StringUtil::StartsWith(&local_70,&local_90);
    bVar2 = !bVar2;
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_70);
  }
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_30);
  return bVar2;
}

Assistant:

static bool IsHTTP(const string &path) {
	return StringUtil::StartsWith(path, "http://") || !StringUtil::StartsWith(path, "https://");
}